

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O2

int run_test_getaddrinfo_fail(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  undefined8 uStack_b0;
  uv_getaddrinfo_t req;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(uVar2,&req,abort,0,0,0);
  if (iVar1 == -0x16) {
    uVar2 = uv_default_loop();
    iVar1 = uv_getaddrinfo(uVar2,&req,getaddrinfo_fail_cb,"xyzzy.xyzzy.xyzzy.",0,0);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      iVar1 = uv_run(uVar2,0);
      if (iVar1 == 0) {
        if (fail_cb_called == 1) {
          loop = (uv_loop_t *)uv_default_loop();
          close_loop(loop);
          uVar2 = uv_default_loop();
          iVar1 = uv_loop_close(uVar2);
          if (iVar1 == 0) {
            return 0;
          }
          pcVar3 = "0 == uv_loop_close(uv_default_loop())";
          uStack_b0 = 0x67;
        }
        else {
          pcVar3 = "fail_cb_called == 1";
          uStack_b0 = 0x65;
        }
      }
      else {
        pcVar3 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
        uStack_b0 = 100;
      }
    }
    else {
      pcVar3 = 
      "0 == uv_getaddrinfo(uv_default_loop(), &req, getaddrinfo_fail_cb, \"xyzzy.xyzzy.xyzzy.\", NULL, NULL)"
      ;
      uStack_b0 = 99;
    }
  }
  else {
    pcVar3 = 
    "UV_EINVAL == uv_getaddrinfo(uv_default_loop(), &req, (uv_getaddrinfo_cb) abort, NULL, NULL, NULL)"
    ;
    uStack_b0 = 0x5b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
          ,uStack_b0,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(getaddrinfo_fail) {
  uv_getaddrinfo_t req;

  ASSERT(UV_EINVAL == uv_getaddrinfo(uv_default_loop(),
                                     &req,
                                     (uv_getaddrinfo_cb) abort,
                                     NULL,
                                     NULL,
                                     NULL));

  /* Use a FQDN by ending in a period */
  ASSERT(0 == uv_getaddrinfo(uv_default_loop(),
                             &req,
                             getaddrinfo_fail_cb,
                             "xyzzy.xyzzy.xyzzy.",
                             NULL,
                             NULL));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(fail_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}